

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O2

bool __thiscall
QGraphicsItem::collidesWithPath(QGraphicsItem *this,QPainterPath *path,ItemSelectionMode mode)

{
  ulong uVar1;
  QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_> QVar2;
  char cVar3;
  undefined1 uVar4;
  long in_FS_OFFSET;
  QPainterPath thisShape;
  undefined1 local_88 [8];
  QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_> local_80;
  QRectF local_78;
  QRectF local_58;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  cVar3 = QPainterPath::isEmpty();
  if (cVar3 == '\0') {
    local_58.w._0_4_ = 0xffffffff;
    local_58.w._4_4_ = 0xffffffff;
    local_58.h._0_4_ = 0xffffffff;
    local_58.h._4_4_ = 0xffffffff;
    local_58.xp._0_4_ = 0xffffffff;
    local_58.xp._4_4_ = 0xffffffff;
    local_58.yp._0_4_ = 0xffffffff;
    local_58.yp._4_4_ = 0xffffffff;
    (*this->_vptr_QGraphicsItem[3])(&local_58,this);
    _q_adjustRect(&local_58);
    local_78.w._0_4_ = 0xffffffff;
    local_78.w._4_4_ = 0xffffffff;
    local_78.h._0_4_ = 0xffffffff;
    local_78.h._4_4_ = 0xffffffff;
    local_78.xp._0_4_ = 0xffffffff;
    local_78.xp._4_4_ = 0xffffffff;
    local_78.yp._0_4_ = 0xffffffff;
    local_78.yp._4_4_ = 0xffffffff;
    QPainterPath::controlPointRect();
    _q_adjustRect(&local_78);
    cVar3 = QRectF::intersects((QRectF *)&local_58);
    if (cVar3 != '\0') {
      local_80.d = (QGraphicsItemPrivate *)&DAT_aaaaaaaaaaaaaaaa;
      QPainterPath::QPainterPath((QPainterPath *)&local_80);
      if (mode < ContainsItemBoundingRect) {
        uVar1 = *(ulong *)&((this->d_ptr).d)->field_0x160;
        if ((uVar1 >> 0x1b & 1) == 0 && (uVar1 & 0x800020000) != 0) {
          clipPath((QGraphicsItem *)local_88);
        }
        else {
          (*this->_vptr_QGraphicsItem[4])(local_88,this);
        }
        QVar2.d = local_80.d;
        local_80.d = (QGraphicsItemPrivate *)local_88;
        local_88 = (undefined1  [8])QVar2.d;
        QPainterPath::~QPainterPath((QPainterPath *)local_88);
      }
      else {
        QPainterPath::addRect((QRectF *)&local_80);
      }
      QPainterPath::QPainterPath((QPainterPath *)local_88);
      cVar3 = QPainterPath::operator==((QPainterPath *)&local_80,(QPainterPath *)local_88);
      QPainterPath::~QPainterPath((QPainterPath *)local_88);
      if (cVar3 == '\0') {
        if ((mode & ~ContainsItemBoundingRect) == IntersectsItemShape) {
          uVar4 = QPainterPath::intersects(path);
        }
        else {
          uVar4 = QPainterPath::contains(path);
        }
      }
      else {
        uVar4 = 0;
      }
      QPainterPath::~QPainterPath((QPainterPath *)&local_80);
      goto LAB_00577d00;
    }
  }
  uVar4 = 0;
LAB_00577d00:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return (bool)uVar4;
}

Assistant:

bool QGraphicsItem::collidesWithPath(const QPainterPath &path, Qt::ItemSelectionMode mode) const
{
    if (path.isEmpty()) {
        // No collision with empty paths.
        return false;
    }

    QRectF rectA(boundingRect());
    _q_adjustRect(&rectA);
    QRectF rectB(path.controlPointRect());
    _q_adjustRect(&rectB);
    if (!rectA.intersects(rectB)) {
        // This we can determine efficiently. If the two rects neither
        // intersect nor contain each other, then the two items do not collide.
        return false;
    }

    // For further testing, we need this item's shape or bounding rect.
    QPainterPath thisShape;
    if (mode == Qt::IntersectsItemShape || mode == Qt::ContainsItemShape)
        thisShape = (isClipped() && !d_ptr->localCollisionHack) ? clipPath() : shape();
    else
        thisShape.addRect(rectA);

    if (thisShape == QPainterPath()) {
        // Empty shape? No collision.
        return false;
    }

    // Use QPainterPath boolean operations to determine the collision, O(N*logN).
    if (mode == Qt::IntersectsItemShape || mode == Qt::IntersectsItemBoundingRect)
        return path.intersects(thisShape);
    return path.contains(thisShape);
}